

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::make_init_node_0
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this)

{
  longdouble lVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
  *this_00;
  uint local_30 [2];
  longdouble local_28;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *local_10;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this_local;
  
  this_00 = &this->nodes;
  local_28 = (longdouble)0;
  local_30[1] = 0;
  local_30[0] = 0;
  local_10 = this;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
  ::emplace_back<long_double,int,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
              *)this_00,&local_28,(int *)(local_30 + 1),local_30);
  sVar2 = shared_subvector::emplace(&this->subvector);
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ::back(this_00);
  pvVar3->variables = sVar2;
  pvVar4 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
           ::operator[](&this->items,1);
  lVar1 = pvVar4->sum_z;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ::back(this_00);
  pvVar3->z = lVar1;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ::back(&this->nodes);
  shared_subvector::fill(&this->subvector,pvVar3->variables,'\0');
  return;
}

Assistant:

void make_init_node_0()
    {
        nodes.emplace_back(Float{ 0 }, 0, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[1].sum_z;

        subvector.fill(nodes.back().variables, 0);
    }